

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

int wabt::interp::IntTruncSat<int,float>(float val)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 local_c;
  float val_local;
  
  uVar2 = std::isnan((double)(ulong)(uint)val);
  if ((uVar2 & 1) == 0) {
    bVar1 = CanConvert<int,float>((f32)val);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_c = (int)val;
    }
    else {
      bVar1 = std::signbit(val);
      iVar3 = std::numeric_limits<int>::min();
      local_c = std::numeric_limits<int>::max();
      if (bVar1) {
        local_c = iVar3;
      }
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

R WABT_VECTORCALL IntTruncSat(T val) {
  if (WABT_UNLIKELY(std::isnan(val))) {
    return 0;
  } else if (WABT_UNLIKELY(!CanConvert<R>(val))) {
    return std::signbit(val) ? std::numeric_limits<R>::min()
                             : std::numeric_limits<R>::max();
  } else {
    return static_cast<R>(val);
  }
}